

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

ly_set * ly_set_dup(ly_set *set)

{
  uint uVar1;
  ly_set *plVar2;
  lys_node **__dest;
  size_t __size;
  
  if (set == (ly_set *)0x0) {
    plVar2 = (ly_set *)0x0;
  }
  else {
    plVar2 = (ly_set *)malloc(0x10);
    plVar2->number = set->number;
    uVar1 = set->size;
    plVar2->size = uVar1;
    __size = (ulong)uVar1 << 3;
    __dest = (lys_node **)malloc(__size);
    (plVar2->set).s = __dest;
    memcpy(__dest,(set->set).s,__size);
  }
  return plVar2;
}

Assistant:

ly_set *
ly_set_dup(const struct ly_set *set)
{
    struct ly_set *new;

    if (!set) {
        return NULL;
    }

    new = malloc(sizeof *new);
    new->number = set->number;
    new->size = set->size;
    new->set.g = malloc(new->size * sizeof *(new->set.g));
    memcpy(new->set.g, set->set.g, new->size * sizeof *(new->set.g));

    return new;
}